

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void cppcms::xss::anon_unknown_8::parse_part(entry *part)

{
  long in_RDI;
  entry *unaff_retaddr;
  entry *in_stack_00000020;
  
  if (*(int *)(in_RDI + 0x10) == 2) {
    parse_html_entity(in_stack_00000020);
  }
  else if (*(int *)(in_RDI + 0x10) == 3) {
    parse_html_tag(unaff_retaddr);
  }
  return;
}

Assistant:

void parse_part(entry &part)
		{
			switch(part.type) {
			case html_entity:
				parse_html_entity(part);
				break;
			case html_tag:
				parse_html_tag(part);
				break;
			default:
				/* Nothing to do in other cases */ ;
			}
		}